

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# least.cpp
# Opt level: O2

void duckdb::LeastGreatestFunction<short,duckdb::LessThan,duckdb::StandardLeastGreatest<false>>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  short sVar1;
  long lVar2;
  ulong uVar3;
  reference pvVar4;
  ulong uVar5;
  ulong uVar6;
  idx_t col_idx;
  ulong uVar7;
  long lVar8;
  long lVar9;
  UnifiedVectorFormat vdata;
  long local_878;
  long local_870;
  bool result_has_value [2048];
  
  lVar8 = *(long *)args;
  lVar9 = *(long *)(args + 8);
  if (lVar9 - lVar8 == 0x68) {
    vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,0);
    duckdb::Vector::Reference(result);
    return;
  }
  for (uVar7 = 0; uVar7 < (ulong)((lVar9 - lVar8) / 0x68); uVar7 = uVar7 + 1) {
    vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,uVar7);
    lVar8 = *(long *)args;
    lVar9 = *(long *)(args + 8);
  }
  lVar2 = *(long *)(result + 0x20);
  uVar7 = 0;
  memset(result_has_value,0,0x800);
  do {
    if ((ulong)((lVar9 - lVar8) / 0x68) <= uVar7) {
      StandardLeastGreatest<false>::FinalizeResult
                (*(idx_t *)(args + 0x18),result_has_value,result,state);
      duckdb::Vector::SetVectorType((VectorType)result);
      return;
    }
    pvVar4 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,uVar7);
    if (*pvVar4 == (value_type)0x2) {
      pvVar4 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,uVar7);
      if ((*(byte **)(pvVar4 + 0x28) == (byte *)0x0) || ((**(byte **)(pvVar4 + 0x28) & 1) != 0))
      goto LAB_0070f427;
    }
    else {
LAB_0070f427:
      duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&vdata);
      pvVar4 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,uVar7);
      duckdb::Vector::ToUnifiedFormat((ulong)pvVar4,*(UnifiedVectorFormat **)(args + 0x18));
      uVar3 = *(ulong *)(args + 0x18);
      if (local_870 == 0) {
        for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
          uVar6 = uVar5;
          if (*_vdata != 0) {
            uVar6 = (ulong)*(uint *)(*_vdata + uVar5 * 4);
          }
          sVar1 = *(short *)(local_878 + uVar6 * 2);
          if ((result_has_value[uVar5] != true) || (sVar1 < *(short *)(lVar2 + uVar5 * 2))) {
            result_has_value[uVar5] = true;
            *(short *)(lVar2 + uVar5 * 2) = sVar1;
          }
        }
      }
      else {
        for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
          uVar6 = uVar5;
          if (*_vdata != 0) {
            uVar6 = (ulong)*(uint *)(*_vdata + uVar5 * 4);
          }
          if (((*(ulong *)(local_870 + (uVar6 >> 6) * 8) >> (uVar6 & 0x3f) & 1) != 0) &&
             ((sVar1 = *(short *)(local_878 + uVar6 * 2), result_has_value[uVar5] != true ||
              (sVar1 < *(short *)(lVar2 + uVar5 * 2))))) {
            result_has_value[uVar5] = true;
            *(short *)(lVar2 + uVar5 * 2) = sVar1;
          }
        }
      }
      UnifiedVectorFormat::~UnifiedVectorFormat(&vdata);
    }
    uVar7 = uVar7 + 1;
    lVar8 = *(long *)args;
    lVar9 = *(long *)(args + 8);
  } while( true );
}

Assistant:

static void LeastGreatestFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	if (args.ColumnCount() == 1) {
		// single input: nop
		result.Reference(args.data[0]);
		return;
	}
	auto &input = BASE_OP::Prepare(args, state);
	auto &result_vector = BASE_OP::TargetVector(result, state);

	auto result_type = VectorType::CONSTANT_VECTOR;
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (args.data[col_idx].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			// non-constant input: result is not a constant vector
			result_type = VectorType::FLAT_VECTOR;
		}
		if (BASE_OP::IS_STRING) {
			// for string vectors we add a reference to the heap of the children
			StringVector::AddHeapReference(result_vector, input.data[col_idx]);
		}
	}

	auto result_data = FlatVector::GetData<T>(result_vector);
	bool result_has_value[STANDARD_VECTOR_SIZE] {false};
	// perform the operation column-by-column
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (input.data[col_idx].GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    ConstantVector::IsNull(input.data[col_idx])) {
			// ignore null vector
			continue;
		}

		UnifiedVectorFormat vdata;
		input.data[col_idx].ToUnifiedFormat(input.size(), vdata);

		auto input_data = UnifiedVectorFormat::GetData<T>(vdata);
		if (!vdata.validity.AllValid()) {
			// potential new null entries: have to check the null mask
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);
				if (vdata.validity.RowIsValid(vindex)) {
					// not a null entry: perform the operation and add to new set
					auto ivalue = input_data[vindex];
					if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
						result_has_value[i] = true;
						result_data[i] = ivalue;
					}
				}
			}
		} else {
			// no new null entries: only need to perform the operation
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);

				auto ivalue = input_data[vindex];
				if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
					result_has_value[i] = true;
					result_data[i] = ivalue;
				}
			}
		}
	}
	BASE_OP::FinalizeResult(input.size(), result_has_value, result, state);
	result.SetVectorType(result_type);
}